

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load_alist.c
# Opt level: O2

mod2sparse * load_alist(char *alist_file)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  mod2entry *pmVar3;
  char *pcVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  int nxt;
  int N;
  int M;
  mod2sparse *local_50;
  int mxcw;
  int mxrw;
  int *local_40;
  int *local_38;
  
  __stream = (FILE *)open_file_std(alist_file,"r");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Can\'t open alist file: %s\n",alist_file);
    exit(1);
  }
  pcVar4 = "%d";
  iVar1 = __isoc99_fscanf(__stream,"%d",&M);
  if ((iVar1 == 1) && (0 < M)) {
    pcVar4 = "%d";
    iVar1 = __isoc99_fscanf(__stream,"%d",&N);
    if ((iVar1 == 1) && (0 < N)) {
      pcVar4 = "%d";
      iVar1 = __isoc99_fscanf(__stream,"%d",&mxrw);
      if (((iVar1 == 1) && (-1 < mxrw)) && (mxrw <= N)) {
        pcVar4 = "%d";
        iVar1 = __isoc99_fscanf(__stream,"%d",&mxcw);
        if (((iVar1 == 1) && (-1 < mxcw)) && (mxcw <= M)) {
          piVar2 = (int *)chk_alloc(M,4);
          lVar6 = 0;
          local_38 = piVar2;
          do {
            if (M <= lVar6) {
              piVar2 = (int *)chk_alloc(N,4);
              lVar6 = 0;
              local_40 = piVar2;
              goto LAB_0012551a;
            }
            pcVar4 = "%d";
            iVar1 = __isoc99_fscanf(__stream,"%d",piVar2);
            if ((iVar1 != 1) || (iVar1 = *piVar2, iVar1 < 0)) break;
            lVar6 = lVar6 + 1;
            piVar2 = piVar2 + 1;
          } while (iVar1 <= N);
        }
      }
    }
  }
  goto LAB_0012554d;
  while( true ) {
    lVar6 = lVar6 + 1;
    piVar2 = piVar2 + 1;
    if (M < iVar1) break;
LAB_0012551a:
    iVar1 = N;
    if (N <= lVar6) goto LAB_00125552;
    pcVar4 = "%d";
    iVar1 = __isoc99_fscanf(__stream,"%d",piVar2);
    if ((iVar1 != 1) || (iVar1 = *piVar2, iVar1 < 0)) break;
  }
LAB_0012554d:
  do {
    iVar1 = (int)pcVar4;
    bad_alist_file();
LAB_00125552:
    local_50 = mod2sparse_allocate(M,iVar1);
    do {
      pcVar4 = "%d";
      iVar1 = __isoc99_fscanf(__stream,"%d",&nxt);
      if (iVar1 != 1) {
        nxt = -1;
        break;
      }
    } while (nxt == 0);
    iVar8 = 0;
    iVar1 = nxt;
    for (uVar7 = 0; (long)uVar7 < (long)M; uVar7 = uVar7 + 1) {
      for (iVar5 = 0; iVar5 < local_38[uVar7]; iVar5 = iVar5 + 1) {
        if ((iVar1 < 1) || (N < iVar1)) goto LAB_0012554d;
        pcVar4 = (char *)(uVar7 & 0xffffffff);
        pmVar3 = mod2sparse_find(local_50,(int)uVar7,iVar1 + -1);
        if (pmVar3 != (mod2entry *)0x0) goto LAB_0012554d;
        mod2sparse_insert(local_50,(int)uVar7,nxt + -1);
        iVar8 = iVar8 + 1;
        do {
          pcVar4 = "%d";
          iVar1 = __isoc99_fscanf(__stream,"%d",&nxt);
          if (iVar1 != 1) {
            nxt = -1;
            break;
          }
        } while (nxt == 0);
        iVar1 = nxt;
      }
    }
    for (lVar6 = 0; lVar6 < N; lVar6 = lVar6 + 1) {
      for (iVar5 = 0; iVar5 < local_40[lVar6]; iVar5 = iVar5 + 1) {
        if ((iVar1 < 1) || (M < iVar1)) goto LAB_0012554d;
        pcVar4 = (char *)(ulong)(iVar1 - 1U);
        pmVar3 = mod2sparse_find(local_50,iVar1 - 1U,(int)lVar6);
        if (pmVar3 == (mod2entry *)0x0) goto LAB_0012554d;
        iVar8 = iVar8 + -1;
        do {
          pcVar4 = "%d";
          iVar1 = __isoc99_fscanf(__stream,"%d",&nxt);
          if (iVar1 != 1) {
            nxt = -1;
            break;
          }
        } while (nxt == 0);
        iVar1 = nxt;
      }
    }
    if (((iVar8 == 0) && (iVar1 == -1)) && (iVar1 = feof(__stream), iVar1 != 0)) {
      return local_50;
    }
  } while( true );
}

Assistant:

mod2sparse *load_alist
(char *alist_file)
{
  FILE *af;

  mod2sparse *H;

  int mxrw, mxcw;
  int *rw, *cw;
  int i, j, k;
  int tot, trans;
  int nxt;
  int M,N;

  af = open_file_std(alist_file,"r");

  if (af==NULL) 
  { fprintf(stderr,"Can't open alist file: %s\n",alist_file);
    exit(1);
  }

  if (fscanf(af,"%d",&M)!=1 || M<1
   || fscanf(af,"%d",&N)!=1 || N<1
   || fscanf(af,"%d",&mxrw)!=1 || mxrw<0 || mxrw>N 
   || fscanf(af,"%d",&mxcw)!=1 || mxcw<0 || mxcw>M)
  { bad_alist_file();
  }

  rw = (int *) chk_alloc (M, sizeof *rw);

  for (i = 0; i<M; i++)
  { if (fscanf(af,"%d",&rw[i])!=1 || rw[i]<0 || rw[i]>N)
    { bad_alist_file();
    }
  }

  cw = (int *) chk_alloc (N, sizeof *cw);

  for (j = 0; j<N; j++)
  { if (fscanf(af,"%d",&cw[j])!=1 || cw[j]<0 || cw[j]>M)
    { bad_alist_file();
    }
  }

   H = mod2sparse_allocate(M,N);

  do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
      
  tot = 0;

  for (i = 0; i<M; i++)
  { for (k = 0; k<rw[i]; k++)
    { if (nxt<=0 || nxt>N || mod2sparse_find(H,i,nxt-1))
      { bad_alist_file();
      }
      mod2sparse_insert(H,i,nxt-1);
      tot += 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  for (j = 0; j<N; j++)
  { for (k = 0; k<cw[j]; k++)
    { if (nxt<=0 || nxt>M || !mod2sparse_find(H,nxt-1,j))
      { bad_alist_file();
      }
      tot -= 1;
      do { if (fscanf(af,"%d",&nxt)!=1) nxt = -1; } while (nxt==0);
    }
  }

  if (tot!=0 || nxt!=-1 || !feof(af))
  { bad_alist_file();
  }

  return H;
}